

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdaux.cpp
# Opt level: O2

void sqstd_printcallstack(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  SQPRINTFUNCTION p_Var2;
  SQRESULT SVar3;
  SQChar *pSVar4;
  SQUnsignedInteger idx;
  char *pcVar5;
  char *pcVar6;
  SQUnsignedInteger level;
  long level_00;
  SQFloat f;
  SQBool bval;
  SQChar *s;
  SQInteger i;
  SQStackInfos si;
  
  p_Var2 = sq_geterrorfunc(v);
  if (p_Var2 != (SQPRINTFUNCTION)0x0) {
    (*p_Var2)(v,"\nCALLSTACK\n");
    level_00 = 1;
    while( true ) {
      SVar3 = sq_stackinfos(v,level_00,&si);
      if (SVar3 < 0) break;
      pcVar5 = si.funcname;
      if (si.funcname == (SQChar *)0x0) {
        pcVar5 = "unknown";
      }
      pcVar6 = si.source;
      if (si.source == (SQChar *)0x0) {
        pcVar6 = "unknown";
      }
      (*p_Var2)(v,"*FUNCTION [%s()] %s line [%d]\n",pcVar5,pcVar6,si.line);
      level_00 = level_00 + 1;
    }
    (*p_Var2)(v,"\nLOCALS\n");
    for (level = 0; level != 10; level = level + 1) {
      idx = 0;
      while( true ) {
        pSVar4 = sq_getlocal(v,level,idx);
        if (pSVar4 == (SQChar *)0x0) break;
        SVar1 = sq_gettype(v,-1);
        if (SVar1 == OT_USERPOINTER) {
          pcVar5 = "[%s] USERPOINTER\n";
LAB_00123cf4:
          (*p_Var2)(v,pcVar5,pSVar4);
        }
        else {
          if (SVar1 == OT_INSTANCE) {
            pcVar5 = "[%s] INSTANCE\n";
            goto LAB_00123cf4;
          }
          if (SVar1 == OT_BOOL) {
            sq_getbool(v,-1,&bval);
            pcVar5 = "false";
            if (bval == 1) {
              pcVar5 = "true";
            }
            pcVar6 = "[%s] %s\n";
LAB_00123cd4:
            (*p_Var2)(v,pcVar6,pSVar4,pcVar5);
          }
          else {
            if (SVar1 == OT_INTEGER) {
              sq_getinteger(v,-1,&i);
              pcVar6 = "[%s] %d\n";
              pcVar5 = (char *)i;
              goto LAB_00123cd4;
            }
            if (SVar1 != OT_FLOAT) {
              if (SVar1 != OT_STRING) {
                if (SVar1 == OT_ARRAY) {
                  pcVar5 = "[%s] ARRAY\n";
                }
                else if (SVar1 == OT_CLOSURE) {
                  pcVar5 = "[%s] CLOSURE\n";
                }
                else if (SVar1 == OT_NATIVECLOSURE) {
                  pcVar5 = "[%s] NATIVECLOSURE\n";
                }
                else if (SVar1 == OT_GENERATOR) {
                  pcVar5 = "[%s] GENERATOR\n";
                }
                else if (SVar1 == OT_THREAD) {
                  pcVar5 = "[%s] THREAD\n";
                }
                else if (SVar1 == OT_CLASS) {
                  pcVar5 = "[%s] CLASS\n";
                }
                else if (SVar1 == OT_WEAKREF) {
                  pcVar5 = "[%s] WEAKREF\n";
                }
                else if (SVar1 == OT_TABLE) {
                  pcVar5 = "[%s] TABLE\n";
                }
                else if (SVar1 == OT_USERDATA) {
                  pcVar5 = "[%s] USERDATA\n";
                }
                else {
                  if (SVar1 != OT_NULL) goto LAB_00123cfc;
                  pcVar5 = "[%s] NULL\n";
                }
                goto LAB_00123cf4;
              }
              sq_getstring(v,-1,&s);
              pcVar6 = "[%s] \"%s\"\n";
              pcVar5 = s;
              goto LAB_00123cd4;
            }
            sq_getfloat(v,-1,&f);
            (*p_Var2)(v,"[%s] %.14g\n",(double)f,pSVar4);
          }
        }
LAB_00123cfc:
        sq_pop(v,1);
        idx = idx + 1;
      }
    }
  }
  return;
}

Assistant:

void sqstd_printcallstack(HSQUIRRELVM v)
{
    SQPRINTFUNCTION pf = sq_geterrorfunc(v);
    if(pf) {
        SQStackInfos si;
        SQInteger i;
        SQFloat f;
        const SQChar *s;
        SQInteger level=1; //1 is to skip this function that is level 0
        const SQChar *name=0;
        SQInteger seq=0;
        pf(v,_SC("\nCALLSTACK\n"));
        while(SQ_SUCCEEDED(sq_stackinfos(v,level,&si)))
        {
            const SQChar *fn=_SC("unknown");
            const SQChar *src=_SC("unknown");
            if(si.funcname)fn=si.funcname;
            if(si.source)src=si.source;
            pf(v,_SC("*FUNCTION [%s()] %s line [%d]\n"),fn,src,si.line);
            level++;
        }
        level=0;
        pf(v,_SC("\nLOCALS\n"));

        for(level=0;level<10;level++){
            seq=0;
            while((name = sq_getlocal(v,level,seq)))
            {
                seq++;
                switch(sq_gettype(v,-1))
                {
                case OT_NULL:
                    pf(v,_SC("[%s] NULL\n"),name);
                    break;
                case OT_INTEGER:
                    sq_getinteger(v,-1,&i);
                    pf(v,_SC("[%s] %d\n"),name,i);
                    break;
                case OT_FLOAT:
                    sq_getfloat(v,-1,&f);
                    pf(v,_SC("[%s] %.14g\n"),name,f);
                    break;
                case OT_USERPOINTER:
                    pf(v,_SC("[%s] USERPOINTER\n"),name);
                    break;
                case OT_STRING:
                    sq_getstring(v,-1,&s);
                    pf(v,_SC("[%s] \"%s\"\n"),name,s);
                    break;
                case OT_TABLE:
                    pf(v,_SC("[%s] TABLE\n"),name);
                    break;
                case OT_ARRAY:
                    pf(v,_SC("[%s] ARRAY\n"),name);
                    break;
                case OT_CLOSURE:
                    pf(v,_SC("[%s] CLOSURE\n"),name);
                    break;
                case OT_NATIVECLOSURE:
                    pf(v,_SC("[%s] NATIVECLOSURE\n"),name);
                    break;
                case OT_GENERATOR:
                    pf(v,_SC("[%s] GENERATOR\n"),name);
                    break;
                case OT_USERDATA:
                    pf(v,_SC("[%s] USERDATA\n"),name);
                    break;
                case OT_THREAD:
                    pf(v,_SC("[%s] THREAD\n"),name);
                    break;
                case OT_CLASS:
                    pf(v,_SC("[%s] CLASS\n"),name);
                    break;
                case OT_INSTANCE:
                    pf(v,_SC("[%s] INSTANCE\n"),name);
                    break;
                case OT_WEAKREF:
                    pf(v,_SC("[%s] WEAKREF\n"),name);
                    break;
                case OT_BOOL:{
                    SQBool bval;
                    sq_getbool(v,-1,&bval);
                    pf(v,_SC("[%s] %s\n"),name,bval == SQTrue ? _SC("true"):_SC("false"));
                             }
                    break;
                default: assert(0); break;
                }
                sq_pop(v,1);
            }
        }
    }
}